

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvtBroadphase.cpp
# Opt level: O3

void __thiscall cbtDbvtBroadphase::collide(cbtDbvtBroadphase *this,cbtDispatcher *dispatcher)

{
  undefined4 uVar1;
  cbtDbvtProxy *pcVar2;
  cbtDbvtProxy *pcVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  cbtDbvtNode *pcVar11;
  undefined4 extraout_var;
  long lVar13;
  cbtDbvtProxy **ppcVar14;
  int iVar15;
  undefined1 *this_00;
  cbtDbvtProxy *data;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [16];
  undefined1 in_ZMM2 [64];
  cbtDbvtVolume curAabb;
  undefined1 local_58 [16];
  cbtScalar local_48 [2];
  cbtScalar acStack_40 [4];
  long lVar12;
  
  this_00 = &this->field_0x8;
  cbtDbvt::optimizeIncremental
            ((cbtDbvt *)this_00,(this->m_dupdates * *(int *)&this->field_0x1c) / 100 + 1);
  if (this->m_fixedleft != 0) {
    iVar9 = (this->m_fupdates * *(int *)&this->field_0x5c) / 100 + 1;
    cbtDbvt::optimizeIncremental((cbtDbvt *)&this->field_0x48,iVar9);
    uVar8 = this->m_fixedleft - iVar9;
    this->m_fixedleft = ~((int)uVar8 >> 0x1f) & uVar8;
  }
  iVar9 = this->m_stageCurrent;
  iVar9 = (iVar9 + 1) - ((iVar9 + 1) - (iVar9 + 1 >> 0x1f) & 0xfffffffeU);
  this->m_stageCurrent = iVar9;
  if (this->m_stageRoots[iVar9] != (cbtDbvtProxy *)0x0) {
    data = this->m_stageRoots[iVar9];
    do {
      pcVar2 = data->links[1];
      ppcVar14 = data->links[0]->links + 1;
      if (data->links[0] == (cbtDbvtProxy *)0x0) {
        ppcVar14 = this->m_stageRoots + data->stage;
      }
      *ppcVar14 = pcVar2;
      if (pcVar2 != (cbtDbvtProxy *)0x0) {
        pcVar2->links[0] = data->links[0];
      }
      data->links[0] = (cbtDbvtProxy *)0x0;
      pcVar3 = this->m_stageRoots[2];
      data->links[1] = pcVar3;
      if (pcVar3 != (cbtDbvtProxy *)0x0) {
        pcVar3->links[0] = data;
      }
      this->m_stageRoots[2] = data;
      cbtDbvt::remove((cbtDbvt *)this_00,(char *)data->leaf);
      local_58._0_8_ = *(undefined8 *)(data->super_cbtBroadphaseProxy).m_aabbMin.m_floats;
      local_58._8_8_ = *(undefined8 *)((data->super_cbtBroadphaseProxy).m_aabbMin.m_floats + 2);
      local_48 = *(cbtScalar (*) [2])(data->super_cbtBroadphaseProxy).m_aabbMax.m_floats;
      acStack_40._0_8_ = *(undefined8 *)((data->super_cbtBroadphaseProxy).m_aabbMax.m_floats + 2);
      pcVar11 = cbtDbvt::insert((cbtDbvt *)&this->field_0x48,(cbtDbvtVolume *)local_58,data);
      data->leaf = pcVar11;
      data->stage = 2;
      data = pcVar2;
    } while (pcVar2 != (cbtDbvtProxy *)0x0);
    this->m_fixedleft = *(int *)&this->field_0x5c;
    this->m_needcleanup = true;
  }
  local_58._0_8_ = &PTR__ICollide_00b478d0;
  bVar7 = this->m_deferedcollide;
  local_58._8_8_ = this;
  if ((bool)bVar7 == true) {
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)this_00,*(cbtDbvtNode **)&this->field_0x8,
               *(cbtDbvtNode **)&this->field_0x48,(ICollide *)local_58);
    bVar7 = this->m_deferedcollide;
  }
  if ((bVar7 & 1) != 0) {
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)this_00,*(cbtDbvtNode **)this_00,*(cbtDbvtNode **)this_00,
               (ICollide *)local_58);
  }
  auVar18 = in_ZMM2._0_16_;
  auVar17 = in_ZMM1._0_16_;
  if (this->m_needcleanup == true) {
    iVar9 = (*(this->m_paircache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
              [7])();
    auVar18 = in_ZMM2._0_16_;
    auVar17 = in_ZMM1._0_16_;
    lVar12 = CONCAT44(extraout_var,iVar9);
    iVar9 = *(int *)(lVar12 + 4);
    if (0 < iVar9) {
      iVar10 = (this->m_cupdates * iVar9) / 100;
      if (iVar10 < this->m_newpairs) {
        iVar10 = this->m_newpairs;
      }
      iVar15 = iVar10;
      if (iVar9 < iVar10) {
        iVar15 = iVar9;
      }
      if (0 < iVar10) {
        iVar9 = 0;
        do {
          lVar13 = (long)((this->m_cid + iVar9) % *(int *)(lVar12 + 4)) * 0x20;
          pfVar4 = *(float **)(*(long *)(*(long *)(lVar12 + 0x10) + 8 + lVar13) + 0x38);
          pfVar5 = *(float **)(*(long *)(*(long *)(lVar12 + 0x10) + lVar13) + 0x38);
          if ((((pfVar4[4] < *pfVar5) || (pfVar5[4] < *pfVar4)) || (pfVar4[5] < pfVar5[1])) ||
             (((pfVar5[5] < pfVar4[1] || (pfVar4[6] < pfVar5[2])) || (pfVar5[6] < pfVar4[2])))) {
            (*(this->m_paircache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
              [3])();
            iVar15 = iVar15 + -1;
            iVar9 = iVar9 + -1;
          }
          auVar18 = in_ZMM2._0_16_;
          auVar17 = in_ZMM1._0_16_;
          iVar9 = iVar9 + 1;
        } while (iVar9 < iVar15);
        iVar9 = *(int *)(lVar12 + 4);
        if (iVar9 < 1) {
          this->m_cid = 0;
          goto LAB_008a4f6a;
        }
      }
      this->m_cid = (iVar15 + this->m_cid) % iVar9;
    }
  }
LAB_008a4f6a:
  this->m_pid = this->m_pid + 1;
  this->m_newpairs = 1;
  this->m_needcleanup = false;
  uVar1 = this->m_updates_call;
  uVar6 = this->m_updates_done;
  auVar16._4_4_ = uVar6;
  auVar16._0_4_ = uVar1;
  auVar17 = vcvtusi2ss_avx512f(auVar17,uVar1);
  auVar18 = vcvtusi2ss_avx512f(auVar18,uVar6);
  auVar16._8_8_ = 0;
  auVar16 = vpsrld_avx(auVar16,1);
  this->m_updates_ratio = (cbtScalar)((uint)(uVar1 != 0) * (int)(auVar18._0_4_ / auVar17._0_4_));
  this->m_updates_call = (int)auVar16._0_8_;
  this->m_updates_done = (int)((ulong)auVar16._0_8_ >> 0x20);
  return;
}

Assistant:

void cbtDbvtBroadphase::collide(cbtDispatcher* dispatcher)
{
	/*printf("---------------------------------------------------------\n");
	printf("m_sets[0].m_leaves=%d\n",m_sets[0].m_leaves);
	printf("m_sets[1].m_leaves=%d\n",m_sets[1].m_leaves);
	printf("numPairs = %d\n",getOverlappingPairCache()->getNumOverlappingPairs());
	{
		int i;
		for (i=0;i<getOverlappingPairCache()->getNumOverlappingPairs();i++)
		{
			printf("pair[%d]=(%d,%d),",i,getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy0->getUid(),
				getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy1->getUid());
		}
		printf("\n");
	}
*/

	SPC(m_profiling.m_total);
	/* optimize				*/
	m_sets[0].optimizeIncremental(1 + (m_sets[0].m_leaves * m_dupdates) / 100);
	if (m_fixedleft)
	{
		const int count = 1 + (m_sets[1].m_leaves * m_fupdates) / 100;
		m_sets[1].optimizeIncremental(1 + (m_sets[1].m_leaves * m_fupdates) / 100);
		m_fixedleft = cbtMax<int>(0, m_fixedleft - count);
	}
	/* dynamic -> fixed set	*/
	m_stageCurrent = (m_stageCurrent + 1) % STAGECOUNT;
	cbtDbvtProxy* current = m_stageRoots[m_stageCurrent];
	if (current)
	{
#if DBVT_BP_ACCURATESLEEPING
		cbtDbvtTreeCollider collider(this);
#endif
		do
		{
			cbtDbvtProxy* next = current->links[1];
			listremove(current, m_stageRoots[current->stage]);
			listappend(current, m_stageRoots[STAGECOUNT]);
#if DBVT_BP_ACCURATESLEEPING
			m_paircache->removeOverlappingPairsContainingProxy(current, dispatcher);
			collider.proxy = current;
			cbtDbvt::collideTV(m_sets[0].m_root, current->aabb, collider);
			cbtDbvt::collideTV(m_sets[1].m_root, current->aabb, collider);
#endif
			m_sets[0].remove(current->leaf);
			ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
			curAabb = cbtDbvtVolume::FromMM(current->m_aabbMin, current->m_aabbMax);
			current->leaf = m_sets[1].insert(curAabb, current);
			current->stage = STAGECOUNT;
			current = next;
		} while (current);
		m_fixedleft = m_sets[1].m_leaves;
		m_needcleanup = true;
	}
	/* collide dynamics		*/
	{
		cbtDbvtTreeCollider collider(this);
		if (m_deferedcollide)
		{
			SPC(m_profiling.m_fdcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, m_sets[1].m_root, collider);
		}
		if (m_deferedcollide)
		{
			SPC(m_profiling.m_ddcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, m_sets[0].m_root, collider);
		}
	}
	/* clean up				*/
	if (m_needcleanup)
	{
		SPC(m_profiling.m_cleanup);
		cbtBroadphasePairArray& pairs = m_paircache->getOverlappingPairArray();
		if (pairs.size() > 0)
		{
			int ni = cbtMin(pairs.size(), cbtMax<int>(m_newpairs, (pairs.size() * m_cupdates) / 100));
			for (int i = 0; i < ni; ++i)
			{
				cbtBroadphasePair& p = pairs[(m_cid + i) % pairs.size()];
				cbtDbvtProxy* pa = (cbtDbvtProxy*)p.m_pProxy0;
				cbtDbvtProxy* pb = (cbtDbvtProxy*)p.m_pProxy1;
				if (!Intersect(pa->leaf->volume, pb->leaf->volume))
				{
#if DBVT_BP_SORTPAIRS
					if (pa->m_uniqueId > pb->m_uniqueId)
						cbtSwap(pa, pb);
#endif
					m_paircache->removeOverlappingPair(pa, pb, dispatcher);
					--ni;
					--i;
				}
			}
			if (pairs.size() > 0)
				m_cid = (m_cid + ni) % pairs.size();
			else
				m_cid = 0;
		}
	}
	++m_pid;
	m_newpairs = 1;
	m_needcleanup = false;
	if (m_updates_call > 0)
	{
		m_updates_ratio = m_updates_done / (cbtScalar)m_updates_call;
	}
	else
	{
		m_updates_ratio = 0;
	}
	m_updates_done /= 2;
	m_updates_call /= 2;
}